

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

nng_stat * nng_stat_child(nng_stat *stat)

{
  nng_stat *pnVar1;
  
  pnVar1 = (nng_stat *)nni_list_first(&stat->s_children);
  return pnVar1;
}

Assistant:

const nng_stat *
nng_stat_child(const nng_stat *stat)
{
#if NNG_ENABLE_STATS
	return (nni_list_first(&stat->s_children));
#else
	NNI_ARG_UNUSED(stat);
	return (NULL);
#endif
}